

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3CursorSeek(sqlite3_context *pContext,Fts3Cursor *pCsr)

{
  int *piVar1;
  sqlite3_vtab *psVar2;
  int errCode;
  int iVar3;
  
  if (pCsr->isRequireSeek == '\0') {
    errCode = 0;
  }
  else {
    errCode = fts3CursorSeekStmt(pCsr);
    if (errCode == 0) {
      psVar2 = (pCsr->base).pVtab;
      piVar1 = &psVar2[4].nRef;
      *piVar1 = *piVar1 + 1;
      sqlite3_bind_int64(pCsr->pStmt,1,pCsr->iPrevId);
      pCsr->isRequireSeek = '\0';
      iVar3 = sqlite3_step(pCsr->pStmt);
      piVar1 = &psVar2[4].nRef;
      *piVar1 = *piVar1 + -1;
      errCode = 0;
      if (((iVar3 != 100) && (errCode = sqlite3_reset(pCsr->pStmt), errCode == 0)) &&
         (errCode = 0, *(long *)&(pCsr->base).pVtab[3].nRef == 0)) {
        pCsr->isEof = '\x01';
        errCode = 0x10b;
      }
      if (iVar3 == 100) {
        return 0;
      }
    }
  }
  if ((pContext != (sqlite3_context *)0x0) && (errCode != 0)) {
    sqlite3_result_error_code(pContext,errCode);
  }
  return errCode;
}

Assistant:

static int fts3CursorSeek(sqlite3_context *pContext, Fts3Cursor *pCsr){
  int rc = SQLITE_OK;
  if( pCsr->isRequireSeek ){
    rc = fts3CursorSeekStmt(pCsr);
    if( rc==SQLITE_OK ){
      Fts3Table *pTab = (Fts3Table*)pCsr->base.pVtab;
      pTab->bLock++;
      sqlite3_bind_int64(pCsr->pStmt, 1, pCsr->iPrevId);
      pCsr->isRequireSeek = 0;
      if( SQLITE_ROW==sqlite3_step(pCsr->pStmt) ){
        pTab->bLock--;
        return SQLITE_OK;
      }else{
        pTab->bLock--;
        rc = sqlite3_reset(pCsr->pStmt);
        if( rc==SQLITE_OK && ((Fts3Table *)pCsr->base.pVtab)->zContentTbl==0 ){
          /* If no row was found and no error has occurred, then the %_content
          ** table is missing a row that is present in the full-text index.
          ** The data structures are corrupt.  */
          rc = FTS_CORRUPT_VTAB;
          pCsr->isEof = 1;
        }
      }
    }
  }

  if( rc!=SQLITE_OK && pContext ){
    sqlite3_result_error_code(pContext, rc);
  }
  return rc;
}